

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

string * __thiscall
crsGA::LogHandler::toDateTime_abi_cxx11_
          (string *__return_storage_ptr__,LogHandler *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *when)

{
  char *__s;
  time_t t;
  long *local_38 [2];
  long local_28 [2];
  long local_18;
  
  local_18 = (when->__d).__r / 1000000000;
  __s = ctime(&local_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_38);
  std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LogHandler::toDateTime(const std::chrono::time_point<std::chrono::system_clock>& when)
{
    auto t = std::chrono::system_clock::to_time_t(when);
    auto dateTime = std::string(std::ctime(&t));
    dateTime = dateTime.substr(0, 24);
    return dateTime;
}